

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

int main(void)

{
  uint in_EAX;
  int iVar1;
  bool bVar2;
  uint64_t unaff_retaddr;
  
  prng_srand(unaff_retaddr,(prng_rand_t *)(ulong)in_EAX);
  iVar1 = test_crop_0();
  bVar2 = true;
  if (iVar1 == 0) {
    iVar1 = test_crop_1();
    bVar2 = true;
    if (iVar1 == 0) {
      iVar1 = test_crop_2();
      bVar2 = true;
      if (iVar1 == 0) {
        iVar1 = test_crop_3();
        bVar2 = true;
        if (iVar1 == 0) {
          iVar1 = test_crop_4();
          bVar2 = iVar1 != 0;
        }
      }
    }
  }
  return (int)bVar2;
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_crop_0()
        || test_crop_1()
        || test_crop_2()
        || test_crop_3()
        || test_crop_4()
        ;
}